

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall ot::commissioner::CommissionerImpl::CancelRequests(CommissionerImpl *this)

{
  uint uVar1;
  CommissionerImpl *this_local;
  
  ProxyClient::CancelRequests(&this->mProxyClient);
  coap::CoapSecure::CancelRequests(&this->mBrClient);
  uVar1 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
  if ((uVar1 & 1) != 0) {
    TokenManager::CancelRequests(&this->mTokenManager);
  }
  return;
}

Assistant:

void CommissionerImpl::CancelRequests()
{
    mProxyClient.CancelRequests();
    mBrClient.CancelRequests();

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        mTokenManager.CancelRequests();
    }
#endif
}